

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data,
                       MQTT_MESSAGE_DETAILS_LIST *mqttMsgEntry,uchar *payload,size_t len,
                       _Bool isDuplicate)

{
  _Bool urlencode;
  uint16_t packetId;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  bool bVar1;
  PMQTTTRANSPORT_HANDLE_DATA pMVar2;
  MQTT_MESSAGE_DETAILS_LIST *pMVar3;
  _Bool _Var4;
  MAP_RESULT MVar5;
  int iVar6;
  char *pcVar7;
  STRING_HANDLE handle;
  MAP_HANDLE handle_00;
  STRING_HANDLE pSVar8;
  STRING_HANDLE pSVar9;
  char *pcVar10;
  LOGGER_LOG p_Var11;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *pIVar12;
  MQTT_MESSAGE_HANDLE handle_01;
  int iVar13;
  size_t index;
  char *pcVar14;
  char **propertyValues;
  char **propertyKeys;
  ulong local_68;
  PMQTTTRANSPORT_HANDLE_DATA local_60;
  MQTT_MESSAGE_DETAILS_LIST *local_58;
  char **local_50;
  uchar *local_48;
  size_t local_40;
  char **local_38;
  
  iotHubMessageHandle = mqttMsgEntry->iotHubMessageEntry->messageHandle;
  local_48 = payload;
  local_40 = len;
  pcVar7 = STRING_c_str(transport_data->topic_MqttEvent);
  urlencode = transport_data->auto_url_encode_decode;
  handle = STRING_construct(pcVar7);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      (*p_Var11)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"addPropertiesTouMqttMessage",0x3ed,1,"Failed to create event topic string handle"
                );
    }
    goto LAB_0013040d;
  }
  handle_00 = IoTHubMessage_Properties(iotHubMessageHandle);
  if (handle_00 == (MAP_HANDLE)0x0) {
LAB_001300f9:
    index = 0;
    local_60 = transport_data;
    local_58 = mqttMsgEntry;
LAB_00130109:
    _Var4 = IoTHubMessage_IsSecurityMessage(iotHubMessageHandle);
    pcVar7 = IoTHubMessage_GetCorrelationId(iotHubMessageHandle);
    if (pcVar7 == (char *)0x0) {
LAB_00130148:
      pcVar7 = IoTHubMessage_GetMessageId(iotHubMessageHandle);
      if (pcVar7 != (char *)0x0) {
        iVar6 = addSystemPropertyToTopicString(handle,index,"mid",pcVar7,urlencode);
        if (iVar6 != 0) goto LAB_001303d1;
        index = index + 1;
      }
      pcVar7 = IoTHubMessage_GetContentTypeSystemProperty(iotHubMessageHandle);
      if (pcVar7 != (char *)0x0) {
        iVar6 = addSystemPropertyToTopicString(handle,index,"ct",pcVar7,urlencode);
        if (iVar6 != 0) goto LAB_001303d1;
        index = index + 1;
      }
      pcVar7 = IoTHubMessage_GetContentEncodingSystemProperty(iotHubMessageHandle);
      if (pcVar7 != (char *)0x0) {
        iVar6 = addSystemPropertyToTopicString(handle,index,"ce",pcVar7,(_Bool)(urlencode | _Var4));
        if (iVar6 != 0) goto LAB_001303d1;
        index = index + 1;
      }
      pcVar7 = IoTHubMessage_GetMessageCreationTimeUtcSystemProperty(iotHubMessageHandle);
      if (pcVar7 == (char *)0x0) {
        if (!_Var4) {
LAB_00130311:
          pcVar7 = IoTHubMessage_GetOutputName(iotHubMessageHandle);
          if (pcVar7 != (char *)0x0) {
            iVar6 = addSystemPropertyToTopicString(handle,index,"on",pcVar7,urlencode);
            if (iVar6 != 0) {
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_001303d1;
              pcVar7 = "Failed setting output name";
              iVar6 = 0x37c;
              goto LAB_001303c6;
            }
            index = index + 1;
          }
          pcVar7 = IoTHubMessage_GetComponentName(iotHubMessageHandle);
          if (pcVar7 != (char *)0x0) {
            iVar6 = addSystemPropertyToTopicString(handle,index,"sub",pcVar7,urlencode);
            if (iVar6 != 0) {
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_001303d1;
              pcVar7 = "Failed setting component name";
              iVar6 = 0x38e;
              goto LAB_001303c6;
            }
            index = index + 1;
          }
          pIVar12 = IoTHubMessage_GetDiagnosticPropertyData(iotHubMessageHandle);
          if (pIVar12 != (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
            pcVar7 = pIVar12->diagnosticCreationTimeUtc;
            if (pcVar7 == (char *)0x0 || pIVar12->diagnosticId == (char *)0x0) {
              if (pIVar12->diagnosticId == (char *)0x0 && pcVar7 == (char *)0x0) goto LAB_00130698;
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 != (LOGGER_LOG)0x0) {
                pcVar7 = "diagid and diagcreationtimeutc must be present simultaneously.";
                iVar6 = 0x3da;
                goto LAB_00130647;
              }
            }
            else {
              pcVar14 = "&";
              pcVar10 = "&";
              if (index == 0) {
                pcVar10 = "";
              }
              iVar6 = STRING_sprintf(handle,"%s%%24.%s=%s",pcVar10,"diagid");
              if (iVar6 == 0) {
                pSVar8 = STRING_construct_sprintf("%s=%s","creationtimeutc",pcVar7);
                if (pSVar8 == (STRING_HANDLE)0x0) {
                  p_Var11 = xlogging_get_log_function();
                  if (p_Var11 != (LOGGER_LOG)0x0) {
                    pcVar7 = "Failed constructing diagnostic context";
                    iVar6 = 0x3ba;
                    goto LAB_00130647;
                  }
                }
                else {
                  pSVar9 = URL_Encode(pSVar8);
                  if ((pSVar9 == (STRING_HANDLE)0x0) ||
                     (pcVar7 = STRING_c_str(pSVar9), pcVar7 == (char *)0x0)) {
                    p_Var11 = xlogging_get_log_function();
                    if (p_Var11 != (LOGGER_LOG)0x0) {
                      (*p_Var11)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                 ,"addDiagnosticPropertiesTouMqttMessage",0x3cf,1,
                                 "Failed encoding diagnostic context value");
                    }
                  }
                  else {
                    if (index == 0xffffffffffffffff) {
                      pcVar14 = "";
                    }
                    iVar6 = STRING_sprintf(handle,"%s%%24.%s=%s",pcVar14,"diagctx",pcVar7);
                    if (iVar6 == 0) {
                      STRING_delete(pSVar9);
                      STRING_delete(pSVar8);
                      goto LAB_00130698;
                    }
                    p_Var11 = xlogging_get_log_function();
                    if (p_Var11 != (LOGGER_LOG)0x0) {
                      (*p_Var11)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                 ,"addDiagnosticPropertiesTouMqttMessage",0x3c7,1,
                                 "Failed setting diagnostic context");
                    }
                    STRING_delete(pSVar9);
                  }
                  STRING_delete(pSVar8);
                }
              }
              else {
                p_Var11 = xlogging_get_log_function();
                if (p_Var11 != (LOGGER_LOG)0x0) {
                  pcVar7 = "Failed setting diagnostic id";
                  iVar6 = 0x3af;
LAB_00130647:
                  (*p_Var11)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                             ,"addDiagnosticPropertiesTouMqttMessage",iVar6,1,pcVar7);
                }
              }
            }
            p_Var11 = xlogging_get_log_function();
            if (p_Var11 != (LOGGER_LOG)0x0) {
              pcVar7 = "Failed adding Diagnostic Properties to uMQTT Message";
              iVar6 = 0x3fd;
              goto LAB_001303fa;
            }
            goto LAB_00130405;
          }
LAB_00130698:
          pMVar3 = local_58;
          packetId = local_58->packet_id;
          pcVar7 = STRING_c_str(handle);
          handle_01 = mqttmessage_create_in_place
                                (packetId,pcVar7,DELIVER_AT_LEAST_ONCE,local_48,local_40);
          if (handle_01 == (MQTT_MESSAGE_HANDLE)0x0) {
            p_Var11 = xlogging_get_log_function();
            iVar6 = 0x417;
            if (p_Var11 != (LOGGER_LOG)0x0) {
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"publishTelemetryMsg",0x416,1,"Failed creating mqtt message");
            }
            goto LAB_001307f2;
          }
          iVar6 = mqttmessage_setIsDuplicateMsg(handle_01,isDuplicate);
          pMVar2 = local_60;
          if (iVar6 == 0) {
            iVar6 = tickcounter_get_current_ms(local_60->msgTickCounter,&pMVar3->msgPublishTime);
            if (iVar6 == 0) {
              iVar6 = mqtt_client_publish(pMVar2->mqttClient,handle_01);
              if (iVar6 == 0) {
                iVar6 = 0;
              }
              else {
                p_Var11 = xlogging_get_log_function();
                iVar6 = 0x42a;
                if (p_Var11 != (LOGGER_LOG)0x0) {
                  pcVar7 = "Failed attempting to publish mqtt message";
                  iVar13 = 0x429;
                  goto LAB_001307df;
                }
              }
            }
            else {
              p_Var11 = xlogging_get_log_function();
              iVar6 = 0x423;
              if (p_Var11 != (LOGGER_LOG)0x0) {
                pcVar7 = "Failed retrieving tickcounter info";
                iVar13 = 0x422;
                goto LAB_001307df;
              }
            }
          }
          else {
            p_Var11 = xlogging_get_log_function();
            iVar6 = 0x41e;
            if (p_Var11 != (LOGGER_LOG)0x0) {
              pcVar7 = "Failed setting DUP flag";
              iVar13 = 0x41d;
LAB_001307df:
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"publishTelemetryMsg",iVar13,1,pcVar7);
            }
          }
          mqttmessage_destroy(handle_01);
LAB_001307f2:
          STRING_delete(handle);
          return iVar6;
        }
LAB_001302b9:
        iVar6 = addSystemPropertyToTopicString
                          (handle,index,"ifid","urn:azureiot:Security:SecurityAgent:1",true);
        if (iVar6 == 0) {
          index = index + 1;
          goto LAB_00130311;
        }
        p_Var11 = xlogging_get_log_function();
        if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_001303d1;
        pcVar7 = "Failed setting Security interface id";
        iVar6 = 0x36a;
LAB_001303c6:
        (*p_Var11)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"addSystemPropertiesTouMqttMessage",iVar6,1,pcVar7);
      }
      else {
        iVar6 = addSystemPropertyToTopicString(handle,index,"ctime",pcVar7,urlencode);
        index = index + 1;
        if (iVar6 == 0 && _Var4) goto LAB_001302b9;
        if (iVar6 == 0) goto LAB_00130311;
      }
    }
    else {
      iVar6 = addSystemPropertyToTopicString(handle,index,"cid",pcVar7,urlencode);
      if (iVar6 == 0) {
        index = index + 1;
        goto LAB_00130148;
      }
    }
LAB_001303d1:
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      pcVar7 = "Failed adding System Properties to uMQTT Message";
      iVar6 = 0x3f7;
LAB_001303fa:
      (*p_Var11)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"addPropertiesTouMqttMessage",iVar6,1,pcVar7);
    }
  }
  else {
    MVar5 = Map_GetInternals(handle_00,&local_38,&local_50,&local_68);
    if (MVar5 == MAP_OK) {
      if (local_68 == 0) goto LAB_001300f9;
      index = 0;
      local_60 = transport_data;
      local_58 = mqttMsgEntry;
      do {
        while (urlencode != false) {
          pSVar8 = URL_EncodeString(local_38[index]);
          pSVar9 = URL_EncodeString(local_50[index]);
          if ((pSVar8 == (STRING_HANDLE)0x0) || (pSVar9 == (STRING_HANDLE)0x0)) {
            p_Var11 = xlogging_get_log_function();
            if (p_Var11 != (LOGGER_LOG)0x0) {
              iVar6 = 0x2cd;
              pcVar7 = "Failed URL Encoding properties";
              goto LAB_0013007d;
            }
LAB_00130084:
            bVar1 = false;
          }
          else {
            pcVar7 = STRING_c_str(pSVar8);
            pcVar10 = STRING_c_str(pSVar9);
            pcVar14 = "&";
            if (local_68 - 1 == index) {
              pcVar14 = "";
            }
            iVar6 = STRING_sprintf(handle,"%s=%s%s",pcVar7,pcVar10,pcVar14);
            if (iVar6 == 0) {
              bVar1 = true;
            }
            else {
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_00130084;
              iVar6 = 0x2d2;
              pcVar7 = "Failed constructing property string.";
LAB_0013007d:
              bVar1 = false;
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addUserPropertiesTouMqttMessage",iVar6,1,pcVar7);
            }
          }
          STRING_delete(pSVar8);
          STRING_delete(pSVar9);
          index = index + 1;
          if ((!bVar1) || (local_68 <= index)) {
            if (!bVar1) goto LAB_00130257;
            goto LAB_00130109;
          }
        }
        pcVar7 = "&";
        if (local_68 - 1 == index) {
          pcVar7 = "";
        }
        iVar6 = STRING_sprintf(handle,"%s=%s%s",local_38[index],local_50[index],pcVar7);
        if (iVar6 != 0) {
          p_Var11 = xlogging_get_log_function();
          if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_00130257;
          pcVar7 = "Failed constructing property string.";
          iVar6 = 0x2dc;
          goto LAB_0013024c;
        }
        index = index + 1;
      } while (index < local_68);
      goto LAB_00130109;
    }
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      pcVar7 = "Failed to get the internals of the property map.";
      iVar6 = 0x2be;
LAB_0013024c:
      (*p_Var11)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"addUserPropertiesTouMqttMessage",iVar6,1,pcVar7);
    }
LAB_00130257:
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      pcVar7 = "Failed adding Properties to uMQTT Message";
      iVar6 = 0x3f1;
      goto LAB_001303fa;
    }
  }
LAB_00130405:
  STRING_delete(handle);
LAB_0013040d:
  p_Var11 = xlogging_get_log_function();
  if (p_Var11 != (LOGGER_LOG)0x0) {
    (*p_Var11)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,"publishTelemetryMsg",0x40e,1,"Failed adding properties to mqtt message");
  }
  return 0x40f;
}

Assistant:

static int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data, MQTT_MESSAGE_DETAILS_LIST* mqttMsgEntry, const unsigned char* payload, size_t len, bool isDuplicate)
{
    int result;
    STRING_HANDLE msgTopic = addPropertiesTouMqttMessage(mqttMsgEntry->iotHubMessageEntry->messageHandle, STRING_c_str(transport_data->topic_MqttEvent), transport_data->auto_url_encode_decode);
    if (msgTopic == NULL)
    {
        LogError("Failed adding properties to mqtt message");
        result = MU_FAILURE;
    }
    else
    {
        MQTT_MESSAGE_HANDLE mqttMsg = mqttmessage_create_in_place(mqttMsgEntry->packet_id, STRING_c_str(msgTopic), DELIVER_AT_LEAST_ONCE, payload, len);
        if (mqttMsg == NULL)
        {
            LogError("Failed creating mqtt message");
            result = MU_FAILURE;
        }
        else
        {
            if (mqttmessage_setIsDuplicateMsg(mqttMsg, isDuplicate) != 0)
            {
                LogError("Failed setting DUP flag");
                result = MU_FAILURE;
            }
            else if (tickcounter_get_current_ms(transport_data->msgTickCounter, &mqttMsgEntry->msgPublishTime) != 0)
            {
                LogError("Failed retrieving tickcounter info");
                result = MU_FAILURE;
            }
            else
            {
                if (mqtt_client_publish(transport_data->mqttClient, mqttMsg) != 0)
                {
                    LogError("Failed attempting to publish mqtt message");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            mqttmessage_destroy(mqttMsg);
        }
        STRING_delete(msgTopic);
    }
    return result;
}